

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O0

int mg_session_receive_message(mg_session *session)

{
  int iVar1;
  long in_RDI;
  int status;
  mg_session *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  mg_linear_allocator_reset
            ((mg_linear_allocator *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x48) = 0;
  *(undefined8 *)(in_RDI + 0x58) = 0;
  do {
    iVar1 = mg_session_read_chunk(in_stack_ffffffffffffffe8);
  } while (iVar1 == 1);
  return iVar1;
}

Assistant:

int mg_session_receive_message(mg_session *session) {
  // At this point, we reset the session decoder allocator and all objects from
  // the previous message are lost.
  mg_linear_allocator_reset((mg_linear_allocator *)session->decoder_allocator);
  session->in_end = 0;
  session->in_cursor = 0;
  int status;
  do {
    status = mg_session_read_chunk(session);
  } while (status == 1);
  return status;
}